

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamManager.cpp
# Opt level: O2

void __thiscall TeamManager::_showMenu(TeamManager *this)

{
  allocator<char> local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,"= Team Managing =\n",&local_e9);
  Console::writeLine(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"[1]. Construct team from trash",&local_e9);
  Console::writeLine(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"[2]. Show Team",&local_e9)
  ;
  Console::writeLine(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"[3]. Add Hero",&local_e9);
  Console::writeLine(&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"[4]. Remove Hero\n",&local_e9);
  Console::writeLine(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"[5]. Hero Encyclopedia\n",&local_e9);
  Console::writeLine(&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"[6]. Back",&local_e9);
  Console::writeLine(&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  return;
}

Assistant:

void TeamManager::_showMenu()
{
    Console::writeLine("= Team Managing =\n");
    Console::writeLine("[1]. Construct team from trash");
    Console::writeLine("[2]. Show Team");
    Console::writeLine("[3]. Add Hero");
    Console::writeLine("[4]. Remove Hero\n");
    Console::writeLine("[5]. Hero Encyclopedia\n");
    Console::writeLine("[6]. Back");
}